

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_c11_unittests.cc
# Opt level: O3

void __thiscall
DenseHashMapMoveTest_EraseConstIterator_Test::~DenseHashMapMoveTest_EraseConstIterator_Test
          (DenseHashMapMoveTest_EraseConstIterator_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(DenseHashMapMoveTest, EraseConstIterator)
{
    dense_hash_map<int, int> h;
    h.set_empty_key(0);
    h.set_deleted_key(-1);

    h[1] = 1;
    const auto it = h.begin();
    ASSERT_TRUE(h.end() == h.erase(it));
    ASSERT_EQ(0, (int)h.size());
}